

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xml.cpp
# Opt level: O1

ON_Xform * __thiscall ON_XMLVariant::AsXform(ON_Xform *__return_storage_ptr__,ON_XMLVariant *this)

{
  bool bVar1;
  long lVar2;
  ON_XMLVariantPrivate *pOVar3;
  ON_Xform *pOVar4;
  ON_Xform *pOVar5;
  byte bVar6;
  
  bVar6 = 0;
  pOVar3 = this->_private;
  if (pOVar3->_type == String) {
    bVar1 = ON_wString::IsValidMatrix(&pOVar3->_string_val);
    if (bVar1) {
      (*this->_vptr_ON_XMLVariant[0x31])(this,0x10);
      pOVar3 = this->_private;
      goto LAB_0068fab7;
    }
  }
  else if (pOVar3->_type == Matrix) {
LAB_0068fab7:
    pOVar4 = (ON_Xform *)&pOVar3->field_2;
    goto LAB_0068fac4;
  }
  pOVar4 = &ON_Xform::Zero4x4;
LAB_0068fac4:
  pOVar5 = __return_storage_ptr__;
  for (lVar2 = 0x10; lVar2 != 0; lVar2 = lVar2 + -1) {
    pOVar5->m_xform[0][0] = *(double *)pOVar4;
    pOVar4 = (ON_Xform *)((long)pOVar4 + (ulong)bVar6 * -0x10 + 8);
    pOVar5 = (ON_Xform *)((long)pOVar5 + ((ulong)bVar6 * -2 + 1) * 8);
  }
  return __return_storage_ptr__;
}

Assistant:

ON_Xform ON_XMLVariant::AsXform(void) const
{
  switch (_private->_type)
  {
  case Types::Matrix:
    return _private->m_xform;

  case Types::String:
    if (_private->_string_val.IsValidMatrix())
    {
      StringToPoint(16);
      return _private->m_xform;
    }

  default:
    return ON_Xform::Zero4x4;
  }
}